

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O0

void __thiscall
vkt::wsi::anon_unknown_0::CheckIncompleteResult<vk::VkPresentModeKHR>::operator()
          (CheckIncompleteResult<vk::VkPresentModeKHR> *this,ResultCollector *results,
          InstanceInterface *vki,VkPhysicalDevice physDevice,VkSurfaceKHR surface,
          size_t expectedCompleteSize)

{
  bool bVar1;
  reference pvVar2;
  byte local_f1;
  allocator<char> local_b9;
  string local_b8;
  VkPresentModeKHR *local_98;
  __normal_iterator<vk::VkPresentModeKHR_*,_std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>_>
  local_90;
  __normal_iterator<vk::VkPresentModeKHR_*,_std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>_>
  local_88;
  deUint64 local_80;
  VkPresentModeKHR *local_78;
  __normal_iterator<vk::VkPresentModeKHR_*,_std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>_>
  local_70;
  deUint32 local_68;
  deUint32 usedSize;
  allocator<vk::VkPresentModeKHR> local_51;
  undefined1 local_50 [8];
  vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> outputData;
  size_t expectedCompleteSize_local;
  VkPhysicalDevice physDevice_local;
  InstanceInterface *vki_local;
  ResultCollector *results_local;
  CheckIncompleteResult<vk::VkPresentModeKHR> *this_local;
  VkSurfaceKHR surface_local;
  
  if (expectedCompleteSize != 0) {
    outputData.super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)expectedCompleteSize;
    std::allocator<vk::VkPresentModeKHR>::allocator(&local_51);
    std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::vector
              ((vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *)local_50,
               expectedCompleteSize,&local_51);
    std::allocator<vk::VkPresentModeKHR>::~allocator(&local_51);
    local_68 = (deUint32)
               ((ulong)outputData.
                       super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage / 3);
    local_70._M_current =
         (VkPresentModeKHR *)
         std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::begin
                   ((vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *)local_50)
    ;
    local_78 = (VkPresentModeKHR *)
               std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::end
                         ((vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *)
                          local_50);
    ::vk::ValidateQueryBits::
    fillBits<__gnu_cxx::__normal_iterator<vk::VkPresentModeKHR*,std::vector<vk::VkPresentModeKHR,std::allocator<vk::VkPresentModeKHR>>>>
              (local_70,(__normal_iterator<vk::VkPresentModeKHR_*,_std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>_>
                         )local_78,0xde);
    this->m_count = local_68;
    this->m_result = VK_SUCCESS;
    local_80 = surface.m_internal;
    pvVar2 = std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::operator[]
                       ((vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *)
                        local_50,0);
    (*this->_vptr_CheckIncompleteResult[2])(this,vki,physDevice,local_80,pvVar2);
    local_f1 = 1;
    if ((this->m_count == local_68) && (local_f1 = 1, this->m_result == VK_INCOMPLETE)) {
      local_90._M_current =
           (VkPresentModeKHR *)
           std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::begin
                     ((vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *)
                      local_50);
      local_88 = __gnu_cxx::
                 __normal_iterator<vk::VkPresentModeKHR_*,_std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>_>
                 ::operator+(&local_90,(ulong)this->m_count);
      local_98 = (VkPresentModeKHR *)
                 std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::end
                           ((vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *)
                            local_50);
      bVar1 = ::vk::ValidateQueryBits::
              checkBits<__gnu_cxx::__normal_iterator<vk::VkPresentModeKHR*,std::vector<vk::VkPresentModeKHR,std::allocator<vk::VkPresentModeKHR>>>>
                        (local_88,(__normal_iterator<vk::VkPresentModeKHR_*,_std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>_>
                                   )local_98,0xde);
      local_f1 = bVar1 ^ 0xff;
    }
    if ((local_f1 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Query didn\'t return VK_INCOMPLETE",&local_b9);
      tcu::ResultCollector::fail(results,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::~vector
              ((vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *)local_50);
  }
  return;
}

Assistant:

void operator() (tcu::ResultCollector&		results,
					 const InstanceInterface&	vki,
					 const VkPhysicalDevice		physDevice,
					 const VkSurfaceKHR			surface,
					 const std::size_t			expectedCompleteSize)
	{
		if (expectedCompleteSize == 0)
			return;

		vector<T>		outputData	(expectedCompleteSize);
		const deUint32	usedSize	= static_cast<deUint32>(expectedCompleteSize / 3);

		ValidateQueryBits::fillBits(outputData.begin(), outputData.end());	// unused entries should have this pattern intact
		m_count		= usedSize;
		m_result	= VK_SUCCESS;

		getResult(vki, physDevice, surface, &outputData[0]);				// update m_count and m_result

		if (m_count != usedSize || m_result != VK_INCOMPLETE || !ValidateQueryBits::checkBits(outputData.begin() + m_count, outputData.end()))
			results.fail("Query didn't return VK_INCOMPLETE");
	}